

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpFileInfo.c
# Opt level: O0

int UpnpFileInfo_set_ContentType(UpnpFileInfo *p,char *s)

{
  char *pcVar1;
  char *q;
  char *s_local;
  UpnpFileInfo *p_local;
  
  pcVar1 = (char *)ixmlCloneDOMString(s);
  if (pcVar1 != (char *)0x0) {
    ixmlFreeDOMString(p->m_ContentType);
    p->m_ContentType = pcVar1;
  }
  p_local._4_4_ = (uint)(pcVar1 != (char *)0x0);
  return p_local._4_4_;
}

Assistant:

int UpnpFileInfo_set_ContentType(UpnpFileInfo *p, const DOMString s)
{
	DOMString q = ixmlCloneDOMString(s);
	if (!q)
		return 0;
	ixmlFreeDOMString(p->m_ContentType);
	p->m_ContentType = q;

	return 1;
}